

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_data.cpp
# Opt level: O3

FFlagDef * FindFlag(PClass *type,char *part1,char *part2,bool strict)

{
  NameEntry *pNVar1;
  int iVar2;
  FFlagDef *pFVar3;
  PClass *pPVar4;
  long lVar5;
  
  pNVar1 = FName::NameData.NameArray;
  if (part2 == (char *)0x0) {
    lVar5 = 0;
    do {
      if ((FlagLists[lVar5].Use & 1) != 0) {
        pPVar4 = type;
        if (*FlagLists[lVar5].Type != type) {
          do {
            pPVar4 = pPVar4->ParentClass;
            if (pPVar4 == *FlagLists[lVar5].Type) break;
          } while (pPVar4 != (PClass *)0x0);
          if (pPVar4 == (PClass *)0x0) goto LAB_00518b68;
        }
        pFVar3 = FindFlag(FlagLists[lVar5].Defs,FlagLists[lVar5].NumDefs,part1);
        if (pFVar3 != (FFlagDef *)0x0) {
          return pFVar3;
        }
      }
LAB_00518b68:
      lVar5 = lVar5 + 1;
      if (lVar5 == (ulong)!strict * 5 + 2) {
        return (FFlagDef *)0x0;
      }
    } while( true );
  }
  lVar5 = 0x10;
  while( true ) {
    pPVar4 = (PClass *)**(long **)(&UNK_0070b260 + lVar5);
    iVar2 = strcasecmp(pNVar1[(pPVar4->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.
                              Index].Text,part1);
    if (iVar2 == 0) break;
    lVar5 = lVar5 + 0x18;
    if (lVar5 == 0xb8) {
      return (FFlagDef *)0x0;
    }
  }
  if (pPVar4 != type) {
    do {
      type = type->ParentClass;
      if (type == pPVar4) break;
    } while (type != (PClass *)0x0);
    if (type == (PClass *)0x0) {
      return (FFlagDef *)0x0;
    }
  }
  pFVar3 = FindFlag(*(FFlagDef **)(&UNK_0070b268 + lVar5),*(int *)((long)&FlagLists[0].Type + lVar5)
                    ,part2);
  return pFVar3;
}

Assistant:

FFlagDef *FindFlag (const PClass *type, const char *part1, const char *part2, bool strict)
{
	FFlagDef *def;

	if (part2 == NULL)
	{ // Search all lists
		int max = strict ? 2 : NUM_FLAG_LISTS;
		for (int i = 0; i < max; ++i)
		{
			if ((FlagLists[i].Use & 1) && type->IsDescendantOf (*FlagLists[i].Type))
			{
				def = FindFlag (FlagLists[i].Defs, FlagLists[i].NumDefs, part1);
				if (def != NULL)
				{
					return def;
				}
			}
		}
	}
	else
	{ // Search just the named list
		for (size_t i = 0; i < NUM_FLAG_LISTS; ++i)
		{
			if (stricmp ((*FlagLists[i].Type)->TypeName.GetChars(), part1) == 0)
			{
				if (type->IsDescendantOf (*FlagLists[i].Type))
				{
					return FindFlag (FlagLists[i].Defs, FlagLists[i].NumDefs, part2);
				}
				else
				{
					return NULL;
				}
			}
		}
	}
	return NULL;
}